

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * __thiscall
CMU462::Matrix3x3::operator-(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  Matrix3x3 *pMVar1;
  int i;
  long lVar2;
  Matrix3x3 *A;
  Matrix3x3 *C;
  long lVar3;
  
  pMVar1 = __return_storage_ptr__;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(double *)((long)__return_storage_ptr__ + lVar3) =
           *(double *)((long)this + lVar3) - *(double *)((long)B + lVar3);
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
    lVar2 = lVar2 + 1;
    this = (Matrix3x3 *)((long)this + 8);
    B = (Matrix3x3 *)((long)B + 8);
    __return_storage_ptr__ = (Matrix3x3 *)((long)__return_storage_ptr__ + 8);
  } while (lVar2 != 3);
  return pMVar1;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = A(i,j) - B(i,j);
    }

    return C;
  }